

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

void deqp::gls::AttributeLocationTestUtil::runTest
               (TestContext *testCtx,RenderContext *renderCtx,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *attributes,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preAttachBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preLinkBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *postLinkBind,bool relink,bool reattach,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *reattachAttributes)

{
  ostringstream *poVar1;
  mapped_type_conflict mVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  GLuint program;
  GLenum GVar6;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar7;
  long *plVar8;
  pair<unsigned_int,_unsigned_int> pVar9;
  TestError *this;
  ulong *puVar10;
  long lVar11;
  char *description;
  pointer pBVar12;
  long lVar13;
  pointer pAVar14;
  TestLog *pTVar15;
  long lVar16;
  ScopedLogSection section;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  activeBindings;
  deInt32 status;
  ulong *local_3e8;
  ulong local_3d8;
  long lStack_3d0;
  TestLog *local_3c8;
  RenderContext *local_3c0;
  TestContext *local_3b8;
  ScopedLogSection local_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  undefined8 local_388;
  TestLog *local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_378;
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  Functions *gl;
  
  pTVar15 = testCtx->m_log;
  local_3c0 = renderCtx;
  local_3b8 = testCtx;
  iVar5 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  pBVar12 = (preAttachBind->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right =
       local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(preAttachBind->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3) *
          -0x33333333) {
    lVar16 = 0;
    lVar13 = 0;
    do {
      mVar2 = *(mapped_type_conflict *)((long)&pBVar12->m_location + lVar16);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&local_378,
                            (key_type *)((long)&(pBVar12->m_attribute)._M_dataplus._M_p + lVar16));
      *pmVar7 = mVar2;
      lVar13 = lVar13 + 1;
      pBVar12 = (preAttachBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x28;
    } while (lVar13 < (int)((ulong)((long)(preAttachBind->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar12) >> 3) * -0x33333333);
  }
  pBVar12 = (preLinkBind->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(preLinkBind->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3) *
          -0x33333333) {
    lVar16 = 0;
    lVar13 = 0;
    do {
      mVar2 = *(mapped_type_conflict *)((long)&pBVar12->m_location + lVar16);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&local_378,
                            (key_type *)((long)&(pBVar12->m_attribute)._M_dataplus._M_p + lVar16));
      *pmVar7 = mVar2;
      lVar13 = lVar13 + 1;
      pBVar12 = (preLinkBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x28;
    } while (lVar13 < (int)((ulong)((long)(preLinkBind->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar12) >> 3) * -0x33333333);
  }
  local_328._0_8_ = (TestLog *)(local_328 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Attributes","");
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Attribute information","");
  tcu::ScopedLogSection::ScopedLogSection(&local_3b0,pTVar15,(string *)local_328,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_3c8 = pTVar15;
  if ((TestLog *)local_328._0_8_ != (TestLog *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,local_318[0]._M_allocated_capacity + 1);
  }
  pAVar14 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(attributes->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar14) >> 7)) {
    local_380 = local_3b8->m_log;
    poVar1 = (ostringstream *)(local_328 + 8);
    lVar16 = 0;
    lVar13 = 0;
    do {
      local_328._0_8_ = local_380;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Type: ",6);
      local_3a8 = local_398;
      lVar11 = *(long *)((long)&(pAVar14->m_type).m_name._M_dataplus._M_p + lVar16);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,lVar11,
                 *(long *)((long)&(pAVar14->m_type).m_name._M_string_length + lVar16) + lVar11);
      local_388 = *(undefined8 *)((long)&(pAVar14->m_type).m_locationSize + lVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(char *)local_3a8,local_3a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", Name: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,*(char **)((long)&(pAVar14->m_name)._M_dataplus._M_p + lVar16),
                 *(long *)((long)&(pAVar14->m_name)._M_string_length + lVar16));
      iVar5 = *(int *)((long)&pAVar14->m_layoutLocation + lVar16);
      local_3e8 = &local_3d8;
      if (iVar5 == -1) {
        local_3d8 = local_3d8 & 0xffffffffffffff00;
        lVar11 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,iVar5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0xb63359);
        puVar10 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar10) {
          local_3d8 = *puVar10;
          lStack_3d0 = plVar8[3];
        }
        else {
          local_3d8 = *puVar10;
          local_3e8 = (ulong *)*plVar8;
        }
        lVar11 = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_3e8,lVar11)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if ((iVar5 != -1) && (local_348[0] != local_338)) {
        operator_delete(local_348[0],local_338[0] + 1);
      }
      if (local_3a8 != local_398) {
        operator_delete(local_3a8,local_398[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_2b0);
      lVar13 = lVar13 + 1;
      pAVar14 = (attributes->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x80;
    } while (lVar13 < (int)((ulong)((long)(attributes->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pAVar14) >> 7));
  }
  tcu::TestLog::endSection(local_3b0.m_log);
  pTVar15 = local_3c8;
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = local_3c8;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Create program.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  program = (*gl->createProgram)();
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glCreateProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2cf);
  if ((preAttachBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (preAttachBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes(pTVar15,gl,program,preAttachBind);
  }
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar15;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Create and attach shaders to program.",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  bVar3 = anon_unknown_1::hasAttributeAliasing
                    (attributes,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&local_378);
  pVar9 = anon_unknown_1::createAndAttachShaders(pTVar15,local_3c0,program,attributes,bVar3);
  if ((preLinkBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (preLinkBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes(pTVar15,gl,program,preLinkBind);
  }
  poVar1 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar15;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Link program.",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2b0);
  (*gl->linkProgram)(program);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glLinkProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2dd);
  anon_unknown_1::logProgram(pTVar15,gl,program);
  (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"glGetProgramiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x162);
  if (local_328._0_4_ == 1) {
    bVar3 = anon_unknown_1::checkQuery
                      (pTVar15,gl,program,attributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)&local_378);
    if ((postLinkBind->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (postLinkBind->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      anon_unknown_1::bindAttributes(pTVar15,gl,program,postLinkBind);
      bVar4 = anon_unknown_1::checkQuery
                        (pTVar15,gl,program,attributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar3 = bVar3 && bVar4;
    }
    if (relink) {
      poVar1 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = pTVar15;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Relink program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_2b0);
      (*gl->linkProgram)(program);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x2f1);
      anon_unknown_1::logProgram(pTVar15,gl,program);
      (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glGetProgramiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x162);
      if (local_328._0_4_ != 1) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x2f4);
        goto LAB_0096e070;
      }
      pBVar12 = (postLinkBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(postLinkBind->
                                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar12) >> 3)
              * -0x33333333) {
        lVar16 = 0;
        lVar13 = 0;
        do {
          mVar2 = *(mapped_type_conflict *)((long)&pBVar12->m_location + lVar16);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&local_378,
                                (key_type *)
                                ((long)&(pBVar12->m_attribute)._M_dataplus._M_p + lVar16));
          *pmVar7 = mVar2;
          lVar13 = lVar13 + 1;
          pBVar12 = (postLinkBind->
                    super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar16 = lVar16 + 0x28;
        } while (lVar13 < (int)((ulong)((long)(postLinkBind->
                                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pBVar12) >> 3) * -0x33333333);
      }
      pTVar15 = local_3c8;
      bVar4 = anon_unknown_1::checkQuery
                        (local_3c8,gl,program,attributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar3 = (bool)(bVar3 & bVar4);
    }
    if (reattach) {
      (*gl->detachShader)(program,pVar9.first);
      (*gl->detachShader)(program,pVar9.second);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glDetachShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x301);
      poVar1 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = pTVar15;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Create and attach shaders to program.",0x25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_2b0);
      bVar4 = anon_unknown_1::hasAttributeAliasing
                        (reattachAttributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      anon_unknown_1::createAndAttachShaders(pTVar15,local_3c0,program,reattachAttributes,bVar4);
      poVar1 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = pTVar15;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Relink program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_2b0);
      (*gl->linkProgram)(program);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x308);
      anon_unknown_1::logProgram(pTVar15,gl,program);
      (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"glGetProgramiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x162);
      if (local_328._0_4_ != 1) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x30b);
        goto LAB_0096e070;
      }
      bVar4 = anon_unknown_1::checkQuery
                        (pTVar15,gl,program,reattachAttributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar3 = (bool)(bVar3 & bVar4);
    }
    (*gl->deleteProgram)(program);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glDeleteProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x312);
    description = "Fail";
    if (bVar3 != false) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult(local_3b8,(uint)(bVar3 ^ 1),description);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_378);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Program link failed","getProgramLinkStatus(gl, program)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
             ,0x2e0);
LAB_0096e070:
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void runTest (tcu::TestContext&			testCtx,
			glu::RenderContext&			renderCtx,
			const vector<Attribute>&	attributes,
			const vector<Bind>&			preAttachBind,
			const vector<Bind>&			preLinkBind,
			const vector<Bind>&			postLinkBind,
			bool						relink,
			bool						reattach = false,
			const vector<Attribute>&	reattachAttributes = vector<Attribute>())
{
	TestLog&					log			= testCtx.getLog();
	const glw::Functions&		gl			= renderCtx.getFunctions();
	deUint32					program		= 0;
	pair<deUint32, deUint32>	shaders;

	try
	{
		bool					isOk			= true;
		map<string, deUint32>	activeBindings;

		for (int bindNdx = 0; bindNdx < (int)preAttachBind.size(); bindNdx++)
			activeBindings[preAttachBind[bindNdx].getAttributeName()] = preAttachBind[bindNdx].getLocation();

		for (int bindNdx = 0; bindNdx < (int)preLinkBind.size(); bindNdx++)
			activeBindings[preLinkBind[bindNdx].getAttributeName()] = preLinkBind[bindNdx].getLocation();

		{
			tcu::ScopedLogSection section(log, "Attributes", "Attribute information");
			logAttributes(testCtx.getLog(), attributes);
		}

		log << TestLog::Message << "Create program." << TestLog::EndMessage;
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram()");

		if (!preAttachBind.empty())
			bindAttributes(log, gl, program, preAttachBind);

		log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
		shaders = createAndAttachShaders(log, renderCtx, program, attributes, hasAttributeAliasing(attributes, activeBindings));

		if (!preLinkBind.empty())
			bindAttributes(log, gl, program, preLinkBind);

		log << TestLog::Message << "Link program." << TestLog::EndMessage;

		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

		logProgram(log, gl, program);
		TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

		if (!checkQuery(log, gl, program, attributes, activeBindings))
			isOk = false;

		if (!postLinkBind.empty())
		{
			bindAttributes(log, gl, program, postLinkBind);

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (relink)
		{
			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			for (int bindNdx = 0; bindNdx < (int)postLinkBind.size(); bindNdx++)
				activeBindings[postLinkBind[bindNdx].getAttributeName()] = postLinkBind[bindNdx].getLocation();

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (reattach)
		{
			gl.detachShader(program, shaders.first);
			gl.detachShader(program, shaders.second);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader()");

			log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
			createAndAttachShaders(log, renderCtx, program, reattachAttributes, hasAttributeAliasing(reattachAttributes, activeBindings));

			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			if (!checkQuery(log, gl, program, reattachAttributes, activeBindings))
				isOk = false;
		}

		gl.deleteProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (isOk)
			testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		throw;
	}
}